

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DESKey.cpp
# Opt level: O2

ByteString * __thiscall DESKey::getKeyCheckValue(ByteString *__return_storage_ptr__,DESKey *this)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  CryptoFactory *pCVar4;
  long *plVar5;
  size_t sVar6;
  uchar *__s;
  undefined8 uStackY_e0;
  ByteString data;
  ByteString encryptedFinal;
  ByteString local_78;
  ByteString iv;
  long lVar3;
  undefined4 extraout_var_00;
  
  ByteString::ByteString(&iv);
  ByteString::ByteString(&data);
  ByteString::ByteString(__return_storage_ptr__);
  ByteString::ByteString(&encryptedFinal);
  iVar2 = (*(this->super_SymmetricKey).super_Serialisable._vptr_Serialisable[7])(this);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (lVar3 == 0x38) {
    uStackY_e0 = 2;
  }
  else {
    if ((lVar3 != 0x70) && (lVar3 != 0xa8)) goto LAB_0014baf0;
    uStackY_e0 = 3;
  }
  pCVar4 = CryptoFactory::i();
  iVar2 = (**pCVar4->_vptr_CryptoFactory)(pCVar4,uStackY_e0);
  plVar5 = (long *)CONCAT44(extraout_var_00,iVar2);
  if (plVar5 == (long *)0x0) goto LAB_0014baf0;
  sVar6 = (**(code **)(*plVar5 + 0x68))(plVar5);
  ByteString::resize(&data,sVar6);
  __s = ByteString::operator[](&data,0);
  sVar6 = ByteString::size(&data);
  memset(__s,0,sVar6);
  ByteString::ByteString(&local_78);
  cVar1 = (**(code **)(*plVar5 + 0x10))(plVar5,this,4,&iv,0,0,&local_78,0);
  if (cVar1 == '\0') {
LAB_0014bad5:
    ByteString::~ByteString(&local_78);
  }
  else {
    cVar1 = (**(code **)(*plVar5 + 0x18))(plVar5,&data,__return_storage_ptr__);
    if (cVar1 == '\0') goto LAB_0014bad5;
    cVar1 = (**(code **)(*plVar5 + 0x20))(plVar5,&encryptedFinal);
    ByteString::~ByteString(&local_78);
    if (cVar1 != '\0') {
      pCVar4 = CryptoFactory::i();
      (*pCVar4->_vptr_CryptoFactory[1])(pCVar4,plVar5);
      ByteString::operator+=(__return_storage_ptr__,&encryptedFinal);
      ByteString::resize(__return_storage_ptr__,3);
      goto LAB_0014baf0;
    }
  }
  pCVar4 = CryptoFactory::i();
  (*pCVar4->_vptr_CryptoFactory[1])(pCVar4,plVar5);
LAB_0014baf0:
  ByteString::~ByteString(&encryptedFinal);
  ByteString::~ByteString(&data);
  ByteString::~ByteString(&iv);
  return __return_storage_ptr__;
}

Assistant:

ByteString DESKey::getKeyCheckValue() const
{
	SymAlgo::Type algo = SymAlgo::Unknown;
	ByteString iv;
	ByteString data;
	ByteString encryptedData;
	ByteString encryptedFinal;


	switch (this->getBitLen())
	{
		case 56:
			algo = SymAlgo::DES;
			break;
		case 112:
		case 168:
			algo = SymAlgo::DES3;
			break;
		default:
			return encryptedData;
	}

	SymmetricAlgorithm* cipher = CryptoFactory::i()->getSymmetricAlgorithm(algo);
	if (cipher == NULL) return encryptedData;

	// Single block of null (0x00) bytes
	data.resize(cipher->getBlockSize());
	memset(&data[0], 0, data.size());

	if (!cipher->encryptInit(this, SymMode::ECB, iv, false) ||
	    !cipher->encryptUpdate(data, encryptedData) ||
	    !cipher->encryptFinal(encryptedFinal))
	{
		CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
		return encryptedData;
	}
	CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);

	encryptedData += encryptedFinal;
	encryptedData.resize(3);

	return encryptedData;
}